

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveVectors(FastText *this)

{
  string *in_stack_00000288;
  FastText *in_stack_00000290;
  string local_28 [8];
  char *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1832e7);
  std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  saveVectors(in_stack_00000290,in_stack_00000288);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void FastText::saveVectors() {
  saveVectors(args_->output + ".vec");
}